

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QJsonValue *o)

{
  Type TVar1;
  _func_int **pp_Var2;
  qint64 i;
  storage_type *in_RCX;
  QJsonValue *in_RDX;
  char *string;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  double f;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QDebugStateSaver saver;
  QJsonObject local_68;
  QDebug local_60;
  QJsonArray local_58;
  QDebug local_50;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)o);
  TVar1 = (in_RDX->value).t;
  if (TVar1 < False) {
    if (TVar1 < Array) {
      if (TVar1 != Integer) {
        pQVar3 = (QTextStream *)(o->value).n;
        *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
        ba_04.m_data = in_RCX;
        ba_04.m_size = (qsizetype)"QJsonValue(string, ";
        QString::fromUtf8(&local_40,(QString *)0x13,ba_04);
        QTextStream::operator<<(pQVar3,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar3 = (QTextStream *)(o->value).n;
        if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
          QTextStream::operator<<(pQVar3,' ');
        }
        QJsonValue::toString(&local_40,in_RDX);
        if ((QChar *)local_40.d.ptr == (QChar *)0x0) {
          local_40.d.ptr = &QString::_empty;
        }
        QDebug::putString((QDebug *)o,(QChar *)local_40.d.ptr,local_40.d.size);
        pQVar3 = (QTextStream *)(o->value).n;
        if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
          QTextStream::operator<<(pQVar3,' ');
          pQVar3 = (QTextStream *)(o->value).n;
        }
        QTextStream::operator<<(pQVar3,')');
        pQVar3 = (QTextStream *)(o->value).n;
        if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
          QTextStream::operator<<(pQVar3,' ');
        }
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_002f8067;
      }
      pQVar3 = (QTextStream *)(o->value).n;
      *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)"QJsonValue(double, ";
      QString::fromUtf8(&local_40,(QString *)0x13,ba_00);
      QTextStream::operator<<(pQVar3,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = (QTextStream *)(o->value).n;
      if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar3,' ');
        pQVar3 = (QTextStream *)(o->value).n;
      }
      i = QJsonValue::toInteger(in_RDX,0);
      QTextStream::operator<<(pQVar3,i);
      pQVar3 = (QTextStream *)(o->value).n;
      if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar3,' ');
        pQVar3 = (QTextStream *)(o->value).n;
      }
      QTextStream::operator<<(pQVar3,')');
      goto LAB_002f8054;
    }
    if (TVar1 == Array) {
      pQVar3 = (QTextStream *)(o->value).n;
      *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)"QJsonValue(array, ";
      QString::fromUtf8(&local_40,(QString *)0x12,ba_01);
      QTextStream::operator<<(pQVar3,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_58.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
      if (*(char *)&(((QCborContainerPrivate *)local_58.a.d.ptr)->elements).d.ptr == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.a.d.ptr,' ');
        local_58.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
      }
      *(int *)&(((__uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
                &(((QList<QtCbor::Element> *)((long)local_58.a.d.ptr + 0x28))->d).d)->_M_t).
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
           *(int *)&(((__uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                       *)&(((QList<QtCbor::Element> *)((long)local_58.a.d.ptr + 0x28))->d).d)->_M_t)
                    .
                    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                    .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + 1;
      QJsonValue::toArray((QJsonValue *)&local_40);
      operator<<((Stream *)&local_50,&local_58);
      QDebug::~QDebug(&local_50);
      QJsonArray::~QJsonArray((QJsonArray *)&local_40);
      QDebug::~QDebug((QDebug *)&local_58);
      QTextStream::operator<<((QTextStream *)(o->value).n,')');
      goto LAB_002f8054;
    }
    pQVar3 = (QTextStream *)(o->value).n;
    *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
    ba_05.m_data = in_RCX;
    ba_05.m_size = (qsizetype)"QJsonValue(object, ";
    QString::fromUtf8(&local_40,(QString *)0x13,ba_05);
    QTextStream::operator<<(pQVar3,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.o.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
    if (*(char *)&(((QCborContainerPrivate *)local_68.o.d.ptr)->elements).d.ptr == '\x01') {
      QTextStream::operator<<((QTextStream *)local_68.o.d.ptr,' ');
      local_68.o.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
    }
    *(int *)&(((__uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
              &(((QList<QtCbor::Element> *)((long)local_68.o.d.ptr + 0x28))->d).d)->_M_t).
             super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
             super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
         *(int *)&(((__uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *
                    )&(((QList<QtCbor::Element> *)((long)local_68.o.d.ptr + 0x28))->d).d)->_M_t).
                  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                  .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + 1;
    QJsonValue::toObject((QJsonValue *)&local_40);
    operator<<((Stream *)&local_60,&local_68);
    QDebug::~QDebug(&local_60);
    QJsonObject::~QJsonObject((QJsonObject *)&local_40);
    QDebug::~QDebug((QDebug *)&local_68);
    QTextStream::operator<<((QTextStream *)(o->value).n,')');
    pQVar3 = (QTextStream *)(o->value).n;
    if (*(char *)&pQVar3[3]._vptr_QTextStream != '\x01') goto LAB_002f8067;
  }
  else {
    if (TVar1 < Undefined) {
      if ((uint)(TVar1 + 0xfffffeec) < 2) {
        pQVar3 = (QTextStream *)(o->value).n;
        *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
        ba.m_data = in_RCX;
        ba.m_size = (qsizetype)"QJsonValue(bool, ";
        QString::fromUtf8(&local_40,(QString *)0x11,ba);
        QTextStream::operator<<(pQVar3,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar3 = (QTextStream *)(o->value).n;
        if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
          QTextStream::operator<<(pQVar3,' ');
          pQVar3 = (QTextStream *)(o->value).n;
        }
        string = "false";
        if ((in_RDX->value).t == True) {
          string = "true";
        }
        QTextStream::operator<<(pQVar3,string);
        pQVar3 = (QTextStream *)(o->value).n;
        if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
          QTextStream::operator<<(pQVar3,' ');
          pQVar3 = (QTextStream *)(o->value).n;
        }
        QTextStream::operator<<(pQVar3,')');
      }
      else {
        pQVar3 = (QTextStream *)(o->value).n;
        ba_03.m_data = in_RCX;
        ba_03.m_size = (qsizetype)"QJsonValue(null)";
        QString::fromUtf8(&local_40,(QString *)0x10,ba_03);
        QTextStream::operator<<(pQVar3,&local_40);
LAB_002f7dc5:
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      if (TVar1 == Undefined) {
        pQVar3 = (QTextStream *)(o->value).n;
        ba_02.m_data = in_RCX;
        ba_02.m_size = (qsizetype)"QJsonValue(undefined)";
        QString::fromUtf8(&local_40,(QString *)0x15,ba_02);
        QTextStream::operator<<(pQVar3,&local_40);
        goto LAB_002f7dc5;
      }
      pQVar3 = (QTextStream *)(o->value).n;
      *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
      ba_06.m_data = in_RCX;
      ba_06.m_size = (qsizetype)"QJsonValue(double, ";
      QString::fromUtf8(&local_40,(QString *)0x13,ba_06);
      QTextStream::operator<<(pQVar3,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = (QTextStream *)(o->value).n;
      if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar3,' ');
      }
      TVar1 = (in_RDX->value).t;
      if (TVar1 == Integer) {
        f = (double)(in_RDX->value).n;
      }
      else {
        f = 0.0;
        if (TVar1 == Double) {
          f = (double)(in_RDX->value).n;
        }
      }
      QTextStream::operator<<((QTextStream *)(o->value).n,f);
      pQVar3 = (QTextStream *)(o->value).n;
      if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar3,' ');
        pQVar3 = (QTextStream *)(o->value).n;
      }
      QTextStream::operator<<(pQVar3,')');
    }
LAB_002f8054:
    pQVar3 = (QTextStream *)(o->value).n;
    if (*(char *)&pQVar3[3]._vptr_QTextStream == '\0') goto LAB_002f8067;
  }
  QTextStream::operator<<(pQVar3,' ');
LAB_002f8067:
  pp_Var2 = (_func_int **)(o->value).n;
  (o->value).n = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonValue &o)
{
    QDebugStateSaver saver(dbg);
    switch (o.value.type()) {
    case QCborValue::Undefined:
        dbg << "QJsonValue(undefined)";
        break;
    case QCborValue::Null:
        dbg << "QJsonValue(null)";
        break;
    case QCborValue::True:
    case QCborValue::False:
        dbg.nospace() << "QJsonValue(bool, " << o.toBool() << ')';
        break;
    case QCborValue::Integer:
        dbg.nospace() << "QJsonValue(double, " << o.toInteger() << ')';
        break;
    case QCborValue::Double:
        dbg.nospace() << "QJsonValue(double, " << o.toDouble() << ')';
        break;
    case QCborValue::String:
        dbg.nospace() << "QJsonValue(string, " << o.toString() << ')';
        break;
    case QCborValue::Array:
        dbg.nospace() << "QJsonValue(array, ";
        dbg << o.toArray();
        dbg << ')';
        break;
    case QCborValue::Map:
        dbg.nospace() << "QJsonValue(object, ";
        dbg << o.toObject();
        dbg << ')';
        break;
    default:
        Q_UNREACHABLE();
    }
    return dbg;
}